

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocketPrivate::~QSslSocketPrivate(QSslSocketPrivate *this)

{
  ~QSslSocketPrivate(this);
  operator_delete(this,0x410);
  return;
}

Assistant:

QSslSocketPrivate::~QSslSocketPrivate()
{
}